

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

int configure_control_block(void)

{
  int iVar1;
  agent_type aVar2;
  agent_control_block *__s;
  void *vaddr;
  int ret;
  int fd;
  
  iVar1 = shm_open("/lancetcontrol",0x242,0x1b0);
  if (iVar1 == -1) {
    ret = 1;
  }
  else {
    ret = ftruncate(iVar1,0x54);
    if (ret == 0) {
      __s = (agent_control_block *)mmap((void *)0x0,0x54,3,1,iVar1,0);
      if (__s == (agent_control_block *)0xffffffffffffffff) {
        ret = 1;
      }
      else {
        acb = __s;
        memset(__s,0,0x54);
        iVar1 = get_thread_count();
        acb->thread_count = iVar1;
        memcpy(acb,cfg->idist,0x34);
        free(cfg->idist);
        cfg->idist = &acb->idist;
        aVar2 = get_agent_type();
        acb->agent_type = aVar2;
        ret = 0;
      }
    }
  }
  return ret;
}

Assistant:

static int configure_control_block(void)
{
	int fd, ret;
	void *vaddr;

	fd = shm_open("/lancetcontrol", O_RDWR | O_CREAT | O_TRUNC, 0660);
	if (fd == -1)
		return 1;

	ret = ftruncate(fd, sizeof(struct agent_control_block));
	if (ret)
		return ret;

	vaddr = mmap(NULL, sizeof(struct agent_control_block),
				 PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
	if (vaddr == MAP_FAILED)
		return 1;

	acb = vaddr;

	bzero((void *)acb, sizeof(struct agent_control_block));
	acb->thread_count = get_thread_count();
	acb->idist = *cfg->idist;
	free(cfg->idist);
	cfg->idist = &acb->idist;
	acb->agent_type = get_agent_type();

	return 0;
}